

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.c
# Opt level: O3

ALLEGRO_SHADER_PLATFORM resolve_platform(ALLEGRO_SHADER_PLATFORM platform)

{
  uint uVar1;
  ALLEGRO_DISPLAY *display;
  
  if (platform != ALLEGRO_SHADER_AUTO) {
    return platform;
  }
  display = al_get_current_display();
  uVar1 = al_get_display_flags(display);
  return ((uVar1 & 4) == 0) + ALLEGRO_SHADER_GLSL;
}

Assistant:

static ALLEGRO_SHADER_PLATFORM resolve_platform(ALLEGRO_SHADER_PLATFORM platform)
{
   if (platform == ALLEGRO_SHADER_AUTO) {
      ALLEGRO_DISPLAY *display = al_get_current_display();
      ASSERT(display);
      if (al_get_display_flags(display) & ALLEGRO_OPENGL) {
         platform = ALLEGRO_SHADER_GLSL;
      }
      else {
         platform = ALLEGRO_SHADER_HLSL;
      }
   }

   return platform;
}